

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_sqrt_vt_m_v_deriv(REF_DBL *m,REF_DBL *v,REF_DBL *f,REF_DBL *df_dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = *v;
  dVar1 = v[1];
  dVar2 = v[2];
  dVar3 = (m[5] * dVar2 + m[2] * dVar3 + dVar1 * m[4]) * dVar2 +
          (m[2] * dVar2 + *m * dVar3 + m[1] * dVar1) * dVar3 +
          (m[4] * dVar2 + m[1] * dVar3 + m[3] * dVar1) * dVar1;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  *f = dVar3;
  *df_dv = (*m * *v + m[1] * v[1] + m[2] * v[2] + *m * *v + m[1] * v[1] + m[2] * v[2]) *
           (0.5 / dVar3);
  dVar3 = *v * m[1] + v[1] * m[3];
  df_dv[1] = (m[4] * v[2] + dVar3 + dVar3 + m[4] * v[2]) * (0.5 / *f);
  dVar3 = v[2] * m[5] + *v * m[2] + v[1] * m[4];
  df_dv[2] = (dVar3 + dVar3) * (0.5 / *f);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_sqrt_vt_m_v_deriv(REF_DBL *m, REF_DBL *v,
                                                REF_DBL *f, REF_DBL *df_dv) {
  *f = sqrt((v)[0] * ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
            (v)[1] * ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) +
            (v)[2] * ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]));
  df_dv[0] =
      0.5 / (*f) *
      ((v)[0] * (m)[0] + ((m)[0] * (v)[0] + (m)[1] * (v)[1] + (m)[2] * (v)[2]) +
       (v)[1] * (m)[1] + (v)[2] * (m)[2]);
  df_dv[1] =
      0.5 / (*f) *
      ((v)[0] * (m)[1] + (v)[1] * (m)[3] +
       ((m)[1] * (v)[0] + (m)[3] * (v)[1] + (m)[4] * (v)[2]) + (v)[2] * (m)[4]);
  df_dv[2] = 0.5 / (*f) *
             ((v)[0] * (m)[2] + (v)[1] * (m)[4] + (v)[2] * (m)[5] +
              ((m)[2] * (v)[0] + (m)[4] * (v)[1] + (m)[5] * (v)[2]));

  return REF_SUCCESS;
}